

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

size_t libcellml::getComponentIndexInComponentEntity
                 (ComponentEntityPtr *componentParent,ComponentEntityPtr *component)

{
  bool bVar1;
  element_type *index_00;
  ComponentEntity local_38;
  byte local_21;
  size_t sStack_20;
  bool found;
  size_t index;
  ComponentEntityPtr *component_local;
  ComponentEntityPtr *componentParent_local;
  
  sStack_20 = 0;
  local_21 = 0;
  index = (size_t)component;
  component_local = componentParent;
  while (((local_21 ^ 0xff) & 1) != 0) {
    index_00 = std::
               __shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::ComponentEntity,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)component_local);
    ComponentEntity::component(&local_38,(size_t)index_00);
    bVar1 = std::operator==((shared_ptr<libcellml::Component> *)&local_38,
                            (shared_ptr<libcellml::ComponentEntity> *)index);
    std::shared_ptr<libcellml::Component>::~shared_ptr
              ((shared_ptr<libcellml::Component> *)&local_38);
    if (bVar1) {
      local_21 = 1;
    }
    else {
      sStack_20 = sStack_20 + 1;
    }
  }
  return sStack_20;
}

Assistant:

size_t getComponentIndexInComponentEntity(const ComponentEntityPtr &componentParent, const ComponentEntityPtr &component)
{
    size_t index = 0;
    bool found = false;
    while (!found) {
        if (componentParent->component(index) == component) {
            found = true;
        } else {
            ++index;
        }
    }

    return index;
}